

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_reference_block
          (CompilerGLSL *this,uint32_t type_id,bool forward_declaration)

{
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables_primary;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  size_t sVar4;
  CompilerGLSL *this_01;
  SPIRType *pSVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  iterator iVar8;
  TypedID<(spirv_cross::Types)0> *ts_1;
  string *name;
  uint *ts_1_00;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  __hashtable *__h_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  ID *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  long lVar11;
  ulong uVar12;
  uint32_t alignment;
  string buffer_name;
  string decorations;
  Bitset flags;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attributes;
  __node_gen_type __node_gen;
  uint local_12fc;
  key_type local_12f8;
  CompilerGLSL *local_12d8;
  uint32_t local_12cc;
  TypedID<(spirv_cross::Types)1> *local_12c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12c0;
  string local_12a0;
  Bitset local_1280;
  undefined1 local_1240 [16];
  undefined1 local_1230 [264];
  undefined1 local_1128 [16];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1118 [73];
  Buffer *local_110;
  size_t local_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  local_12cc = type_id;
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      type_id);
  local_12f8._M_dataplus._M_p = (pointer)&local_12f8.field_2;
  local_12f8._M_string_length = 0;
  local_12f8.field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000011,forward_declaration) != 0) {
    ts_1 = (TypedID<(spirv_cross::Types)0> *)0x0;
    (*(this->super_Compiler)._vptr_Compiler[6])
              (local_1128,this,(ulong)(pSVar5->super_IVariant).self.id);
    __k = &(pSVar5->super_IVariant).self;
    ::std::__cxx11::string::operator=((string *)&local_12f8,(string *)local_1128);
    pcVar2 = local_1128 + 0x10;
    if ((pointer)local_1128._0_8_ != pcVar2) {
      operator_delete((void *)local_1128._0_8_);
    }
    this_00 = &(this->super_Compiler).ir.meta;
    pmVar6 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,__k);
    if ((((pmVar6->decoration).alias._M_string_length == 0) ||
        (iVar7 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find(&(this->block_ssbo_names)._M_h,&local_12f8),
        iVar7.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0)) ||
       (iVar7 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&(this->resource_names)._M_h,&local_12f8),
       iVar7.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur != (__node_type *)0x0)) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                ((string *)local_1128,(spirv_cross *)0x366a8c,(char (*) [2])__k,ts_1);
      ::std::__cxx11::string::operator=((string *)&local_12f8,(string *)local_1128);
      if ((pointer)local_1128._0_8_ != pcVar2) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    variables_primary = &this->block_ssbo_names;
    name = &local_12f8;
    add_variable(this,variables_primary,&this->resource_names,name);
    if (local_12f8._M_string_length == 0) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                ((string *)local_1128,(spirv_cross *)0x366a8c,(char (*) [2])__k,
                 (TypedID<(spirv_cross::Types)0> *)name);
      ::std::__cxx11::string::operator=((string *)&local_12f8,(string *)local_1128);
      if ((pointer)local_1128._0_8_ != pcVar2) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    local_1128._0_8_ = &this->block_names;
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_1128._0_8_,&local_12f8);
    local_1128._0_8_ = variables_primary;
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)variables_primary,&local_12f8);
    pmVar6 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,__k);
    ::std::__cxx11::string::_M_assign((string *)pmVar6);
    statement<char_const(&)[33],std::__cxx11::string&,char_const(&)[2]>
              (this,(char (*) [33])"layout(buffer_reference) buffer ",&local_12f8,
               (char (*) [2])0x361554);
    goto LAB_001e300b;
  }
  if (*(int *)&(pSVar5->super_IVariant).field_0xc == 0xf) {
    ts_1_00 = (uint *)0x0;
    (*(this->super_Compiler)._vptr_Compiler[6])
              (local_1128,this,(ulong)(pSVar5->super_IVariant).self.id);
  }
  else {
    ts_1_00 = (uint *)0x0;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1128,this,pSVar5);
  }
  ::std::__cxx11::string::operator=((string *)&local_12f8,(string *)local_1128);
  if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
    operator_delete((void *)local_1128._0_8_);
  }
  iVar8 = ::std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->super_Compiler).physical_storage_type_to_alignment._M_h,&local_12cc);
  local_12fc = 0;
  local_12d8 = this;
  if (iVar8.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false>
      ._M_cur == (__node_type *)0x0) {
    if (*(int *)&(pSVar5->super_IVariant).field_0xc == 0xf) goto LAB_001e2b98;
LAB_001e2e6c:
    statement<char_const(&)[33],std::__cxx11::string&>
              (this,(char (*) [33])"layout(buffer_reference) buffer ",&local_12f8);
  }
  else {
    local_12fc = *(uint *)((long)iVar8.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false>
                                 ._M_cur + 0xc);
    if (*(int *)&(pSVar5->super_IVariant).field_0xc == 0xf) {
LAB_001e2b98:
      local_1240._0_8_ = local_1230 + 8;
      local_1240._8_8_ = 0;
      local_1230._0_8_ = 8;
      pcVar2 = local_1128 + 0x10;
      local_1128._0_8_ = pcVar2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"buffer_reference","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1240,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((pointer)local_1128._0_8_ != pcVar2) {
        operator_delete((void *)local_1128._0_8_);
      }
      if (local_12fc != 0) {
        join<char_const(&)[26],unsigned_int&>
                  ((string *)local_1128,(spirv_cross *)0x35a919,(char (*) [26])&local_12fc,ts_1_00);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1240,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if ((pointer)local_1128._0_8_ != pcVar2) {
          operator_delete((void *)local_1128._0_8_);
        }
      }
      buffer_to_packing_standard_abi_cxx11_((string *)local_1128,this,pSVar5,true);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1240,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((pointer)local_1128._0_8_ != pcVar2) {
        operator_delete((void *)local_1128._0_8_);
      }
      ParsedIR::get_buffer_block_type_flags(&local_1280,&(this->super_Compiler).ir,pSVar5);
      paVar1 = &local_12c0.field_2;
      local_12c0._M_string_length = 0;
      local_12c0.field_2._M_local_buf[0] = '\0';
      local_12c0._M_dataplus._M_p = (pointer)paVar1;
      if (((uint)local_1280.lower >> 0x13 & 1) != 0) {
        ::std::__cxx11::string::append((char *)&local_12c0);
      }
      if (((uint)local_1280.lower >> 0x17 & 1) != 0) {
        ::std::__cxx11::string::append((char *)&local_12c0);
      }
      if (((uint)local_1280.lower >> 0x19 & 1) != 0) {
        ::std::__cxx11::string::append((char *)&local_12c0);
      }
      if (((uint)local_1280.lower >> 0x18 & 1) != 0) {
        ::std::__cxx11::string::append((char *)&local_12c0);
      }
      local_110 = local_f8;
      local_1118[0]._M_h._M_buckets = (__buckets_ptr)0x0;
      local_1128._0_8_ =
           (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      local_1128._8_8_ = 0;
      local_108 = 0;
      local_100 = 8;
      StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
      if (local_1240._8_8_ != 0) {
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1240._0_8_ + local_1240._8_8_ * 0x20);
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1240._0_8_;
        do {
          StringStream<4096UL,_4096UL>::append
                    ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar10->_M_dataplus)._M_p,
                     pbVar10->_M_string_length);
          if (pbVar10 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_1240._0_8_ + local_1240._8_8_ * 0x20 + -0x20)) {
            StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
          }
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 != pbVar9);
      }
      StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_12a0,local_1128);
      StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
      this = local_12d8;
      statement<char_const(&)[8],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&>
                (local_12d8,(char (*) [8])"layout(",&local_12a0,(char (*) [2])0x3623fe,&local_12c0,
                 (char (*) [9])0x35a94b,&local_12f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12a0._M_dataplus._M_p != &local_12a0.field_2) {
        operator_delete(local_12a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_12c0._M_dataplus._M_p);
      }
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_1280.higher._M_h);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_1240);
    }
    else {
      if (local_12fc == 0) goto LAB_001e2e6c;
      statement<char_const(&)[51],unsigned_int&,char_const(&)[10],std::__cxx11::string&>
                (this,(char (*) [51])"layout(buffer_reference, buffer_reference_align = ",
                 &local_12fc,(char (*) [10])0x35a94a,&local_12f8);
    }
  }
  statement<char_const(&)[2]>(this,(char (*) [2])0x367845);
  this->indent = this->indent + 1;
  if (*(int *)&(pSVar5->super_IVariant).field_0xc == 0xf) {
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(pSVar5->member_name_cache)._M_h);
    sVar4 = (pSVar5->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    if (sVar4 != 0) {
      local_12c8 = (pSVar5->member_types).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
      lVar11 = sVar4 << 2;
      uVar12 = 0;
      do {
        add_member_name(local_12d8,pSVar5,(uint32_t)uVar12);
        uVar3 = local_12c8[uVar12].id;
        local_1128._0_8_ = local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"","");
        (*(local_12d8->super_Compiler)._vptr_Compiler[0x15])
                  (local_12d8,pSVar5,(ulong)uVar3,uVar12 & 0xffffffff,(string *)local_1128,0);
        if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
          operator_delete((void *)local_1128._0_8_);
        }
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + -4;
      } while (lVar11 != 0);
    }
  }
  else {
    pSVar5 = Compiler::get_pointee_type(&this->super_Compiler,pSVar5);
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1128,this,pSVar5,0);
    (*(this->super_Compiler)._vptr_Compiler[0x26])(local_1240,this,pSVar5);
    statement<std::__cxx11::string,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128,
               (char (*) [7])" value",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1240,
               (char (*) [2])0x361554);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1240._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1230) {
      operator_delete((void *)local_1240._0_8_);
    }
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  this_01 = local_12d8;
  end_scope_decl(local_12d8);
  statement<char_const(&)[1]>(this_01,(char (*) [1])0x35713a);
LAB_001e300b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
    operator_delete(local_12f8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_reference_block(uint32_t type_id, bool forward_declaration)
{
	auto &type = get<SPIRType>(type_id);
	string buffer_name;

	if (forward_declaration)
	{
		// Block names should never alias, but from HLSL input they kind of can because block types are reused for UAVs ...
		// Allow aliased name since we might be declaring the block twice. Once with buffer reference (forward declared) and one proper declaration.
		// The names must match up.
		buffer_name = to_name(type.self, false);

		// Shaders never use the block by interface name, so we don't
		// have to track this other than updating name caches.
		// If we have a collision for any reason, just fallback immediately.
		if (ir.meta[type.self].decoration.alias.empty() ||
		    block_ssbo_names.find(buffer_name) != end(block_ssbo_names) ||
		    resource_names.find(buffer_name) != end(resource_names))
		{
			buffer_name = join("_", type.self);
		}

		// Make sure we get something unique for both global name scope and block name scope.
		// See GLSL 4.5 spec: section 4.3.9 for details.
		add_variable(block_ssbo_names, resource_names, buffer_name);

		// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
		// This cannot conflict with anything else, so we're safe now.
		// We cannot reuse this fallback name in neither global scope (blocked by block_names) nor block name scope.
		if (buffer_name.empty())
			buffer_name = join("_", type.self);

		block_names.insert(buffer_name);
		block_ssbo_names.insert(buffer_name);

		// Ensure we emit the correct name when emitting non-forward pointer type.
		ir.meta[type.self].decoration.alias = buffer_name;
	}
	else if (type.basetype != SPIRType::Struct)
		buffer_name = type_to_glsl(type);
	else
		buffer_name = to_name(type.self, false);

	if (!forward_declaration)
	{
		auto itr = physical_storage_type_to_alignment.find(type_id);
		uint32_t alignment = 0;
		if (itr != physical_storage_type_to_alignment.end())
			alignment = itr->second.alignment;

		if (type.basetype == SPIRType::Struct)
		{
			SmallVector<std::string> attributes;
			attributes.push_back("buffer_reference");
			if (alignment)
				attributes.push_back(join("buffer_reference_align = ", alignment));
			attributes.push_back(buffer_to_packing_standard(type, true));

			auto flags = ir.get_buffer_block_type_flags(type);
			string decorations;
			if (flags.get(DecorationRestrict))
				decorations += " restrict";
			if (flags.get(DecorationCoherent))
				decorations += " coherent";
			if (flags.get(DecorationNonReadable))
				decorations += " writeonly";
			if (flags.get(DecorationNonWritable))
				decorations += " readonly";

			statement("layout(", merge(attributes), ")", decorations, " buffer ", buffer_name);
		}
		else if (alignment)
			statement("layout(buffer_reference, buffer_reference_align = ", alignment, ") buffer ", buffer_name);
		else
			statement("layout(buffer_reference) buffer ", buffer_name);

		begin_scope();

		if (type.basetype == SPIRType::Struct)
		{
			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}
		}
		else
		{
			auto &pointee_type = get_pointee_type(type);
			statement(type_to_glsl(pointee_type), " value", type_to_array_glsl(pointee_type), ";");
		}

		end_scope_decl();
		statement("");
	}
	else
	{
		statement("layout(buffer_reference) buffer ", buffer_name, ";");
	}
}